

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O2

cfg_named_section * cfg_db_find_namedsection(cfg_db *db,char *section_type,char *section_name)

{
  avl_node *paVar1;
  cfg_named_section *pcVar2;
  
  paVar1 = avl_find(&db->sectiontypes,section_type);
  if (paVar1 != (avl_node *)0x0) {
    pcVar2 = (cfg_named_section *)avl_find((avl_tree *)&paVar1[1].parent,section_name);
    return pcVar2;
  }
  return (cfg_named_section *)0x0;
}

Assistant:

struct cfg_named_section *
cfg_db_find_namedsection(const struct cfg_db *db, const char *section_type, const char *section_name) {
  struct cfg_section_type *section;
  struct cfg_named_section *named = NULL;

  section = cfg_db_find_sectiontype(db, section_type);
  if (section != NULL) {
    named = avl_find_element(&section->names, section_name, named, node);
  }
  return named;
}